

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O2

string * searchFilenameInRpaths
                   (string *__return_storage_ptr__,string *rpath_file,string *dependent_file)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  Settings *this;
  pointer pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d0;
  string suffix;
  anon_class_24_3_7b6e7f73 check_path;
  string local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  char buffer [4096];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&rpath,"^@[a-z_]+path/",0x10);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (&suffix,rpath_file,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&rpath,"",0)
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&rpath);
  check_path.dependent_file = dependent_file;
  check_path.rpath_file = rpath_file;
  check_path.fullpath = __return_storage_ptr__;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&rpath_to_fullpath_abi_cxx11_._M_t,rpath_file);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &rpath_to_fullpath_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&local_1078,(string *)rpath_file);
    bVar2 = searchFilenameInRpaths::anon_class_24_3_7b6e7f73::operator()(&check_path,&local_1078);
    std::__cxx11::string::~string((string *)&local_1078);
    if (bVar2) goto LAB_0010729b;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&rpaths_per_file_abi_cxx11_,dependent_file);
    pbVar9 = (pmVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (pmVar5->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar9 == pbVar1) break;
      std::__cxx11::string::string((string *)&rpath,(string *)pbVar9);
      if (rpath._M_dataplus._M_p[rpath._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)&rpath);
      }
      std::operator+(&local_1058,&rpath,&suffix);
      bVar2 = searchFilenameInRpaths::anon_class_24_3_7b6e7f73::operator()(&check_path,&local_1058);
      std::__cxx11::string::~string((string *)&local_1058);
      std::__cxx11::string::~string((string *)&rpath);
      pbVar9 = pbVar9 + 1;
    } while (!bVar2);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&rpath_to_fullpath_abi_cxx11_._M_t,rpath_file);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &rpath_to_fullpath_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) goto LAB_0010729b;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&rpath_to_fullpath_abi_cxx11_,rpath_file);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_0010729b:
  if (__return_storage_ptr__->_M_string_length == 0) {
    iVar3 = Settings::searchPathAmount();
    this = (Settings *)0x0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    uVar8 = extraout_RDX;
    for (; iVar3 != (int)this; this = (Settings *)(ulong)((int)this + 1)) {
      Settings::searchPath_abi_cxx11_(&rpath,this,(int)uVar8);
      std::operator+(&local_10d0,&rpath,&suffix);
      bVar2 = fileExists(&local_10d0);
      std::__cxx11::string::~string((string *)&local_10d0);
      if (bVar2) {
        std::operator+(&local_10d0,&rpath,&suffix);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_10d0);
        std::__cxx11::string::~string((string *)&local_10d0);
        std::__cxx11::string::~string((string *)&rpath);
        break;
      }
      std::__cxx11::string::~string((string *)&rpath);
      uVar8 = extraout_RDX_00;
    }
    if (__return_storage_ptr__->_M_string_length == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING : can\'t get path for \'");
      poVar6 = std::operator<<(poVar6,(string *)rpath_file);
      std::operator<<(poVar6,"\'\n");
      getUserInputDirForFile(&local_10d0,&suffix);
      std::operator+(&rpath,&local_10d0,&suffix);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&rpath);
      std::__cxx11::string::~string((string *)&rpath);
      std::__cxx11::string::~string((string *)&local_10d0);
      pcVar7 = realpath((__return_storage_ptr__->_M_dataplus)._M_p,buffer);
      if (pcVar7 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
  }
  std::__cxx11::string::~string((string *)&suffix);
  return __return_storage_ptr__;
}

Assistant:

std::string searchFilenameInRpaths(const std::string& rpath_file, const std::string& dependent_file)
{
    char buffer[PATH_MAX];
    std::string fullpath;
    std::string suffix = std::regex_replace(rpath_file, std::regex("^@[a-z_]+path/"), "");

    const auto check_path = [&](std::string path)
    {
        char buffer[PATH_MAX];
        std::string file_prefix = dependent_file.substr(0, dependent_file.rfind('/')+1);
        if (dependent_file != rpath_file)
        {
            std::string path_to_check;
            if (path.find("@loader_path") != std::string::npos)
            {
                path_to_check = std::regex_replace(path, std::regex("@loader_path/"), file_prefix);
            }
            else if (path.find("@rpath") != std::string::npos)
            {
                path_to_check = std::regex_replace(path, std::regex("@rpath/"), file_prefix);
            }
            if (realpath(path_to_check.c_str(), buffer))
            {
                fullpath = buffer;
                rpath_to_fullpath[rpath_file] = fullpath;
                return true;
            }
        }
        return false;
    };

    // fullpath previously stored
    if (rpath_to_fullpath.find(rpath_file) != rpath_to_fullpath.end())
    {
        fullpath = rpath_to_fullpath[rpath_file];
    }
    else if (!check_path(rpath_file))
    {
        for (auto rpath : rpaths_per_file[dependent_file])
        {
            if (rpath[rpath.size()-1] != '/') rpath += "/";
            if (check_path(rpath+suffix)) break;
        }
        if (rpath_to_fullpath.find(rpath_file) != rpath_to_fullpath.end())
        {
            fullpath = rpath_to_fullpath[rpath_file];
        }
    }

    if (fullpath.empty())
    {
        const int searchPathAmount = Settings::searchPathAmount();
        for (int n=0; n<searchPathAmount; n++)
        {
            std::string search_path = Settings::searchPath(n);
            if (fileExists(search_path+suffix))
            {
                fullpath = search_path + suffix;
                break;
            }
        }

        if (fullpath.empty())
        {
            std::cerr << "\n/!\\ WARNING : can't get path for '" << rpath_file << "'\n";
            fullpath = getUserInputDirForFile(suffix) + suffix;
            if (realpath(fullpath.c_str(), buffer))
            {
                fullpath = buffer;
            }
        }
    }

    return fullpath;
}